

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TPM2_HMAC(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT handle,TPM2B_MAX_BUFFER *buffer
                ,TPMI_ALG_HASH hashAlg,TPM2B_DIGEST *outHMAC)

{
  UINT16 UVar1;
  TPM_RC TVar2;
  void *p_2;
  void *p_1;
  void *p;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT *pTStack_3090;
  INT32 sizeParamBuf;
  TSS_CMD_CONTEXT *cmdCtx;
  LOGGER_LOG p_Stack_3080;
  TPM_RC cmdResult;
  LOGGER_LOG l;
  undefined1 local_3070 [4];
  TPM_RC result;
  TSS_CMD_CONTEXT CmdCtx;
  TPM2B_DIGEST *outHMAC_local;
  TPM2B_MAX_BUFFER *pTStack_40;
  TPMI_ALG_HASH hashAlg_local;
  TPM2B_MAX_BUFFER *buffer_local;
  TSS_SESSION *pTStack_30;
  TPMI_DH_OBJECT handle_local;
  TSS_SESSION *session_local;
  TSS_DEVICE *tpm_local;
  
  CmdCtx._12312_8_ = outHMAC;
  outHMAC_local._6_2_ = hashAlg;
  pTStack_40 = buffer;
  buffer_local._4_4_ = handle;
  pTStack_30 = session;
  session_local = (TSS_SESSION *)tpm;
  if ((((tpm == (TSS_DEVICE *)0x0) || (session == (TSS_SESSION *)0x0)) ||
      (buffer == (TPM2B_MAX_BUFFER *)0x0)) || (outHMAC == (TPM2B_DIGEST *)0x0)) {
    p_Stack_3080 = xlogging_get_log_function();
    if (p_Stack_3080 != (LOGGER_LOG)0x0) {
      (*p_Stack_3080)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                      ,"TPM2_HMAC",0x194,1,
                      "Invalid parameter specified tpm: %p, session: %p, buffer: %p, outHMAC: %p",
                      session_local,pTStack_30,pTStack_40,CmdCtx._12312_8_);
    }
    tpm_local._4_4_ = 0x101;
  }
  else {
    l._4_4_ = 0;
    cmdCtx._4_4_ = 0;
    pTStack_3090 = (TSS_CMD_CONTEXT *)local_3070;
    paramBuf._4_4_ = 0x1000;
    p = &result;
    local_3070 = (undefined1  [4])0x0;
    if (buffer == (TPM2B_MAX_BUFFER *)0x0) {
      UVar1 = UINT16_Marshal(&NullSize,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
      pTStack_3090->ParamSize = (uint)UVar1 + pTStack_3090->ParamSize;
    }
    else {
      UVar1 = TPM2B_MAX_BUFFER_Marshal(buffer,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
      pTStack_3090->ParamSize = (uint)UVar1 + pTStack_3090->ParamSize;
    }
    UVar1 = UINT16_Marshal((UINT16 *)((long)&outHMAC_local + 6),(BYTE **)&p,
                           (INT32 *)((long)&paramBuf + 4));
    pTStack_3090->ParamSize = (uint)UVar1 + pTStack_3090->ParamSize;
    cmdCtx._4_4_ = TSS_DispatchCmd((TSS_DEVICE *)session_local,0x155,
                                   (TPM_HANDLE *)((long)&buffer_local + 4),1,
                                   &stack0xffffffffffffffd0,1,pTStack_3090);
    tpm_local._4_4_ = cmdCtx._4_4_;
    if (cmdCtx._4_4_ == 0) {
      TVar2 = TPM2B_DIGEST_Unmarshal
                        ((TPM2B_DIGEST *)CmdCtx._12312_8_,&pTStack_3090->RespBufPtr,
                         (INT32 *)&pTStack_3090->RespBytesLeft);
      if (TVar2 == 0) {
        tpm_local._4_4_ = cmdCtx._4_4_;
      }
      else {
        tpm_local._4_4_ = 0x9a;
      }
    }
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC TPM2_HMAC(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          handle,             // IN
    TPM2B_MAX_BUFFER       *buffer,             // IN
    TPMI_ALG_HASH           hashAlg,            // IN
    TPM2B_DIGEST           *outHMAC             // OUT
)
{
    TSS_CMD_CONTEXT  CmdCtx;
    TPM_RC result;
    if (tpm == NULL || session == NULL || buffer == NULL || outHMAC == NULL)
    {
        LogError("Invalid parameter specified tpm: %p, session: %p, buffer: %p, outHMAC: %p", tpm, session, buffer, outHMAC);
        result = TPM_RC_FAILURE;
    }
    else
    {
        result = TPM_RC_SUCCESS;
        BEGIN_CMD();
        TSS_MARSHAL_OPT2B(TPM2B_MAX_BUFFER, buffer);
        TSS_MARSHAL(TPMI_ALG_HASH, &hashAlg);
        DISPATCH_CMD(HMAC, &handle, 1, &session, 1);
        TSS_UNMARSHAL(TPM2B_DIGEST, outHMAC);
        END_CMD();
    }
    return result;
}